

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void math2Func(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  iVar1 = sqlite3_value_numeric_type(*argv);
  if (0xfffffffd < iVar1 - 3U) {
    iVar1 = sqlite3_value_numeric_type(argv[1]);
    if (0xfffffffd < iVar1 - 3U) {
      dVar2 = sqlite3VdbeRealValue(*argv);
      dVar3 = sqlite3VdbeRealValue(argv[1]);
      dVar2 = (double)(*(code *)context->pFunc->pUserData)(dVar2,SUB84(dVar3,0));
      sqlite3VdbeMemSetDouble(context->pOut,dVar2);
      return;
    }
  }
  return;
}

Assistant:

static void math2Func(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int type0, type1;
  double v0, v1, ans;
  double (*x)(double,double);
  assert( argc==2 );
  type0 = sqlite3_value_numeric_type(argv[0]);
  if( type0!=SQLITE_INTEGER && type0!=SQLITE_FLOAT ) return;
  type1 = sqlite3_value_numeric_type(argv[1]);
  if( type1!=SQLITE_INTEGER && type1!=SQLITE_FLOAT ) return;
  v0 = sqlite3_value_double(argv[0]);
  v1 = sqlite3_value_double(argv[1]);
  x = (double(*)(double,double))sqlite3_user_data(context);
  ans = x(v0, v1);
  sqlite3_result_double(context, ans);
}